

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_algebraic.hpp
# Opt level: O2

Opers __thiscall
chaiscript::Operators::to_operator(Operators *this,string_view t_str,bool t_is_unary)

{
  uint32_t uVar1;
  Opers OVar2;
  
  uVar1 = utility::fnv1a::hash((fnv1a *)this,t_str);
  if (uVar1 == 0x8c0cd5e8) {
    OVar2 = assign_shift_left;
  }
  else if (uVar1 == 0x90c1016c) {
    OVar2 = assign_bitwise_and;
  }
  else if (uVar1 == 0x90c34003) {
    OVar2 = not_equal;
  }
  else if (uVar1 == 0x90f4dccf) {
    OVar2 = equals;
  }
  else if (uVar1 == 0x94f721b2) {
    OVar2 = less_than_equal;
  }
  else if (uVar1 == 0x95f72345) {
    OVar2 = shift_left;
  }
  else if (uVar1 == 0xdb0c1b01) {
    OVar2 = bitwise_xor;
  }
  else if (uVar1 == 0xf90c4a3b) {
    OVar2 = bitwise_or;
  }
  else if (uVar1 == 0xfb0c4d61) {
    OVar2 = bitwise_complement;
  }
  else if (uVar1 == 0xfedbf213) {
    OVar2 = pre_increment;
  }
  else if (uVar1 == 0x100edf74) {
    OVar2 = assign_bitwise_xor;
  }
  else if (uVar1 == 0x10b97c27) {
    OVar2 = assign_remainder;
  }
  else if (uVar1 == 0x10cd03df) {
    OVar2 = assign_difference;
  }
  else if (uVar1 == 0x10de4d00) {
    OVar2 = assign_product;
  }
  else if (uVar1 == 0x10fc6214) {
    OVar2 = greater_than_equal;
  }
  else if (uVar1 == 0x13fc66cd) {
    OVar2 = shift_right;
  }
  else if (uVar1 == 0x14588772) {
    OVar2 = assign_bitwise_or;
  }
  else if (uVar1 == 0x14dc14b5) {
    OVar2 = assign_sum;
  }
  else if (uVar1 == 0x200c87a0) {
    OVar2 = remainder;
  }
  else if (uVar1 == 0x20cd1d0f) {
    OVar2 = pre_decrement;
  }
  else if (uVar1 == 0x230c8c59) {
    OVar2 = bitwise_and;
  }
  else if (uVar1 == 0x280c9438) {
    OVar2 = ((uint)t_str._M_str & 0xff) * 2 + difference;
  }
  else if (uVar1 == 0x2a0c975e) {
    OVar2 = quotient;
  }
  else if (uVar1 == 0x2e0c9daa) {
    OVar2 = ((uint)t_str._M_str & 0xff) * 4 + sum;
  }
  else if (uVar1 == 0x2f0c9f3d) {
    OVar2 = product;
  }
  else if (uVar1 == 0x380cad68) {
    OVar2 = assign;
  }
  else if (uVar1 == 0x66560bd0) {
    OVar2 = assign_shift_right;
  }
  else if (uVar1 == 0x3b0cb221) {
    OVar2 = greater_than;
  }
  else if (uVar1 == 0x390caefb) {
    OVar2 = less_than;
  }
  else {
    OVar2 = invalid;
  }
  return OVar2;
}

Assistant:

constexpr static Opers to_operator(std::string_view t_str, bool t_is_unary = false) noexcept {
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4307)
#endif

      const auto op_hash = utility::hash(t_str);
      switch (op_hash) {
        case utility::hash("=="): {
          return Opers::equals;
        }
        case utility::hash("<"): {
          return Opers::less_than;
        }
        case utility::hash(">"): {
          return Opers::greater_than;
        }
        case utility::hash("<="): {
          return Opers::less_than_equal;
        }
        case utility::hash(">="): {
          return Opers::greater_than_equal;
        }
        case utility::hash("!="): {
          return Opers::not_equal;
        }
        case utility::hash("="): {
          return Opers::assign;
        }
        case utility::hash("++"): {
          return Opers::pre_increment;
        }
        case utility::hash("--"): {
          return Opers::pre_decrement;
        }
        case utility::hash("*="): {
          return Opers::assign_product;
        }
        case utility::hash("+="): {
          return Opers::assign_sum;
        }
        case utility::hash("-="): {
          return Opers::assign_difference;
        }
        case utility::hash("&="): {
          return Opers::assign_bitwise_and;
        }
        case utility::hash("|="): {
          return Opers::assign_bitwise_or;
        }
        case utility::hash("<<="): {
          return Opers::assign_shift_left;
        }
        case utility::hash(">>="): {
          return Opers::assign_shift_right;
        }
        case utility::hash("%="): {
          return Opers::assign_remainder;
        }
        case utility::hash("^="): {
          return Opers::assign_bitwise_xor;
        }
        case utility::hash("<<"): {
          return Opers::shift_left;
        }
        case utility::hash(">>"): {
          return Opers::shift_right;
        }
        case utility::hash("%"): {
          return Opers::remainder;
        }
        case utility::hash("&"): {
          return Opers::bitwise_and;
        }
        case utility::hash("|"): {
          return Opers::bitwise_or;
        }
        case utility::hash("^"): {
          return Opers::bitwise_xor;
        }
        case utility::hash("~"): {
          return Opers::bitwise_complement;
        }
        case utility::hash("+"): {
          return t_is_unary ? Opers::unary_plus : Opers::sum;
        }
        case utility::hash("-"): {
          return t_is_unary ? Opers::unary_minus : Opers::difference;
        }
        case utility::hash("/"): {
          return Opers::quotient;
        }
        case utility::hash("*"): {
          return Opers::product;
        }
        default: {
          return Opers::invalid;
        }
      }
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif
    }